

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

uint * __thiscall
Fossilize::StateRecorder::Impl::copy<unsigned_int>
          (Impl *this,uint *src,size_t count,ScratchAllocator *alloc)

{
  uint *puVar1;
  
  if (count != 0) {
    puVar1 = ScratchAllocator::allocate_n<unsigned_int>(alloc,count);
    if (puVar1 != (uint *)0x0) {
      puVar1 = (uint *)memmove(puVar1,src,count << 2);
      return puVar1;
    }
  }
  return (uint *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}